

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.cpp
# Opt level: O2

shared_ptr<HawkTracer::client::CallGraph::TreeNode> __thiscall
HawkTracer::client::CallGraph::_add_new_call
          (CallGraph *this,NodeData *node_data,
          shared_ptr<HawkTracer::client::CallGraph::TreeNode> *parent,
          vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
          *calls)

{
  HT_DurationNs *pHVar1;
  element_type *this_00;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
  __it;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>
  *in_R8;
  __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
  _Var3;
  long lVar4;
  long lVar5;
  shared_ptr<HawkTracer::client::CallGraph::TreeNode> sVar6;
  string *local_68;
  pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *local_60;
  __shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2> *local_58;
  string label;
  
  local_58 = (__shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)
             calls;
  std::__cxx11::string::string((string *)&label,(string *)parent);
  __it._M_current = *(pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> **)in_R8;
  local_60 = *(pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> **)(in_R8 + 8);
  lVar5 = (long)local_60 - (long)__it._M_current;
  local_68 = &label;
  for (lVar4 = lVar5 / 0x18 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
            ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                          *)&local_68,__it);
    _Var3._M_current = __it._M_current;
    if (bVar2) goto LAB_001156c9;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
            ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                          *)&local_68,__it._M_current + 1);
    _Var3._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_001156c9;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
            ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                          *)&local_68,__it._M_current + 2);
    _Var3._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_001156c9;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
            ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                          *)&local_68,__it._M_current + 3);
    _Var3._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_001156c9;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x60;
  }
  lVar5 = lVar5 / 0x18;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var3._M_current = local_60;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
                  ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                                *)&local_68,__it), _Var3._M_current = __it._M_current, bVar2))
      goto LAB_001156c9;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
            ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                          *)&local_68,__it);
    _Var3._M_current = __it._M_current;
    if (bVar2) goto LAB_001156c9;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
          ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                        *)&local_68,__it);
  _Var3._M_current = local_60;
  if (bVar2) {
    _Var3._M_current = __it._M_current;
  }
LAB_001156c9:
  if (_Var3._M_current ==
      *(pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> **)(in_R8 + 8)) {
    std::
    make_shared<HawkTracer::client::CallGraph::TreeNode,HawkTracer::client::CallGraph::NodeData_const&>
              ((NodeData *)this);
    std::__weak_ptr<HawkTracer::client::CallGraph::TreeNode,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<HawkTracer::client::CallGraph::TreeNode,(__gnu_cxx::_Lock_policy)2> *)
               &(this->_root_calls).
                super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start[3].second,local_58);
    local_68 = (string *)CONCAT44(local_68._4_4_,1);
    std::
    vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>
    ::emplace_back<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>&,int>
              (in_R8,(shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)this,(int *)&local_68);
  }
  else {
    this_00 = ((_Var3._M_current)->first).
              super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pHVar1 = &this_00->total_duration;
    *pHVar1 = (long)parent[2].
                    super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi +
              (*pHVar1 -
              (long)parent[2].
                    super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
    NodeData::operator=(&this_00->data,(NodeData *)parent);
    (_Var3._M_current)->second = (_Var3._M_current)->second + 1;
    std::__shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                  *)this,(__shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                          *)_Var3._M_current);
  }
  std::__cxx11::string::~string((string *)&label);
  sVar6.super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar6.super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<HawkTracer::client::CallGraph::TreeNode>)
         sVar6.
         super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CallGraph::TreeNode> CallGraph::_add_new_call(const NodeData& node_data,
                                                              const std::shared_ptr<TreeNode>& parent,
                                                              std::vector<std::pair<std::shared_ptr<TreeNode>, int>>& calls)
{
    std::string label = node_data.label;
    auto call = std::find_if(calls.begin(), calls.end(),
            [&label](const std::pair<std::shared_ptr<TreeNode>, int>& call) {
                return call.first->data.label == label;
            });
    if (call != calls.end())
    {
        call->first->total_duration += node_data.get_duration();
        call->first->data = node_data;
        ++call->second;

        return call->first;
    }
    else
    {
        std::shared_ptr<TreeNode> event_node = std::make_shared<TreeNode>(node_data);
        event_node->parent = parent;
        calls.emplace_back(event_node, 1);

        return event_node;
    }
}